

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::SetBlendConstants
          (VulkanCommandBuffer *this,float *BlendConstants)

{
  char (*in_RCX) [32];
  VkCommandBuffer pVVar1;
  string msg;
  string local_38;
  
  pVVar1 = this->m_VkCmdBuffer;
  if (pVVar1 == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (local_38._M_dataplus._M_p,"SetBlendConstants",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x1c9);
    std::__cxx11::string::~string((string *)&local_38);
    pVVar1 = this->m_VkCmdBuffer;
  }
  (*vkCmdSetBlendConstants)(pVVar1,BlendConstants);
  return;
}

Assistant:

__forceinline void SetBlendConstants(const float BlendConstants[4])
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdSetBlendConstants(m_VkCmdBuffer, BlendConstants);
    }